

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string file;
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_dc = number;
  if (number == 0) {
    std::operator+(&local_d8,&base_name->pathname_,".");
    std::operator+(&local_b8,&local_d8,extension);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    this = &local_d8;
  }
  else {
    std::operator+(&local_58,&base_name->pathname_,"_");
    StreamableToString<int>(&local_78,&local_dc);
    std::operator+(&local_38,&local_58,&local_78);
    std::operator+(&local_d8,&local_38,".");
    std::operator+(&local_b8,&local_d8,extension);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    this = &local_58;
  }
  std::__cxx11::string::~string((string *)this);
  FilePath((FilePath *)&local_b8,&local_98);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}